

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ExternUdpDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternUdpDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::UdpPortListSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          Token *args_4,UdpPortListSyntax *args_5)

{
  Token externKeyword;
  Token primitive;
  ExternUdpDeclSyntax *pEVar1;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  Info *in_RDI;
  long in_R8;
  ExternUdpDeclSyntax *in_R9;
  Token in_stack_00000000;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  pEVar1 = (ExternUdpDeclSyntax *)
           allocate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  externKeyword.info = in_RCX;
  externKeyword.kind = (short)in_R8;
  externKeyword._2_1_ = (char)((ulong)in_R8 >> 0x10);
  externKeyword.numFlags.raw = (char)((ulong)in_R8 >> 0x18);
  externKeyword.rawLen = (int)((ulong)in_R8 >> 0x20);
  primitive.info = in_RDI;
  primitive.kind = (short)in_RSI;
  primitive._2_1_ = (char)((ulong)in_RSI >> 0x10);
  primitive.numFlags.raw = (char)((ulong)in_RSI >> 0x18);
  primitive.rawLen = (int)((ulong)in_RSI >> 0x20);
  slang::syntax::ExternUdpDeclSyntax::ExternUdpDeclSyntax
            (in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDX[1],externKeyword,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_RDX,primitive,
             in_stack_00000000,*(UdpPortListSyntax **)(in_R8 + 8));
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }